

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall Js::PathTypeHandlerBase::DumpFixedFields(PathTypeHandlerBase *this)

{
  byte bVar1;
  TypePath *this_00;
  bool bVar2;
  bool bVar3;
  PropertyRecord *pPVar4;
  PropertyIndex i_1;
  PropertyIndex i;
  uint uVar5;
  
  if (DAT_0145c381 == '\0') {
    for (uVar5 = 0; uVar5 < (this->super_DynamicTypeHandler).unusedBytes >> 1; uVar5 = uVar5 + 1) {
      pPVar4 = TypePath::GetPropertyId((this->typePath).ptr,uVar5);
      Output::Print(L" %s %d%d%d,",pPVar4 + 1,1,0,0);
    }
  }
  else {
    for (uVar5 = 0; uVar5 < (this->super_DynamicTypeHandler).unusedBytes >> 1; uVar5 = uVar5 + 1) {
      pPVar4 = TypePath::GetPropertyId((this->typePath).ptr,uVar5);
      this_00 = (this->typePath).ptr;
      bVar1 = ((this_00->data).ptr)->maxInitializedLength;
      bVar2 = TypePath::GetIsFixedFieldAt
                        (this_00,(PropertyIndex)uVar5,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      bVar3 = TypePath::GetIsUsedFixedFieldAt
                        ((this->typePath).ptr,(PropertyIndex)uVar5,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      Output::Print(L" %s %d%d%d,",pPVar4 + 1,(ulong)(uVar5 < bVar1),(ulong)bVar2,(ulong)bVar3);
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::DumpFixedFields() const {
        if (FixPropsOnPathTypes())
        {
            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetTypePath()->GetPropertyId(i)->GetBuffer(),
                    i < this->GetTypePath()->GetMaxInitializedLength() ? 1 : 0,
                    this->GetTypePath()->GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    this->GetTypePath()->GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }
        }
        else
        {
            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetTypePath()->GetPropertyId(i)->GetBuffer(), 1, 0, 0);
            }
        }
    }